

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

double __thiscall soplex::SVectorBase<double>::minAbs(SVectorBase<double> *this)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  Nonzero<double> *pNVar4;
  double dVar5;
  double dVar6;
  
  ::soplex::infinity::__tls_init();
  pdVar1 = (double *)__tls_get_addr(&PTR_003b6b60);
  dVar5 = *pdVar1;
  lVar3 = (long)this->memused;
  if (0 < lVar3) {
    lVar2 = lVar3 + 1;
    pNVar4 = this->m_elem + lVar3;
    dVar6 = dVar5;
    do {
      pNVar4 = pNVar4 + -1;
      dVar5 = ABS(pNVar4->val);
      if (dVar6 <= ABS(pNVar4->val)) {
        dVar5 = dVar6;
      }
      lVar2 = lVar2 + -1;
      dVar6 = dVar5;
    } while (1 < lVar2);
  }
  return dVar5;
}

Assistant:

R minAbs() const
   {
      R mini = R(infinity);

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) < mini)
            mini = spxAbs(m_elem[i].val);
      }

      assert(mini >= 0);

      return mini;
   }